

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O3

string * __thiscall
czh::error::location_to_str_abi_cxx11_
          (string *__return_storage_ptr__,error *this,source_location *l)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint uVar11;
  uint __val;
  char *pcVar12;
  undefined8 uVar13;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(undefined8 **)this == (undefined8 *)0x0) {
    pcVar12 = "";
  }
  else {
    pcVar12 = (char *)**(undefined8 **)this;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar12,&local_f1);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,":");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar9) {
    local_b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  uVar7 = 1;
  if (*(long *)this == 0) {
    __val = 0;
  }
  else {
    __val = *(uint *)(*(long *)this + 0x10);
    if (9 < __val) {
      uVar6 = 4;
      uVar11 = __val;
      do {
        uVar7 = uVar6;
        if (uVar11 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0010f141;
        }
        if (uVar11 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0010f141;
        }
        if (uVar11 < 10000) goto LAB_0010f141;
        bVar5 = 99999 < uVar11;
        uVar6 = uVar7 + 4;
        uVar11 = uVar11 / 10000;
      } while (bVar5);
      uVar7 = uVar7 + 1;
    }
  }
LAB_0010f141:
  paVar9 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_d0,(ulong)uVar7,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,__val);
  uVar1 = CONCAT44(local_d0._M_string_length._4_4_,(uint)local_d0._M_string_length) +
          local_b0._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    uVar13 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar1) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar9) {
      uVar13 = local_d0.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar13) {
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d0,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_0010f1c3;
    }
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,local_d0._M_dataplus._M_p,
                     CONCAT44(local_d0._M_string_length._4_4_,(uint)local_d0._M_string_length));
LAB_0010f1c3:
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar3 == paVar10) {
    local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  local_f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,":");
  local_90._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar10) {
    local_90.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if (*(long *)this == 0) {
    pcVar12 = "";
  }
  else {
    pcVar12 = *(char **)(*(long *)this + 8);
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90,pcVar12);
  local_70._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar10) {
    local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,"()");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar10) {
    uVar13 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar9) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string location_to_str(const std::source_location &l)
  {
    return std::string(l.file_name()) + ":" + std::to_string(l.line()) +
           ":" + l.function_name() + "()";
  }